

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_scalevaluesi2(short *idata,long tilelen,double scale,double zero,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  double zero_local;
  double scale_local;
  long tilelen_local;
  short *idata_local;
  
  for (dvalue = 0.0; (long)dvalue < tilelen; dvalue = (double)((long)dvalue + 1)) {
    dVar1 = ((double)(int)idata[(long)dvalue] - zero) / scale;
    if (-32768.49 <= dVar1) {
      if (dVar1 <= 32767.49) {
        if (dVar1 < 0.0) {
          idata[(long)dvalue] = (short)(int)(dVar1 - 0.5);
        }
        else {
          idata[(long)dvalue] = (short)(int)(dVar1 + 0.5);
        }
      }
      else {
        *status = -0xb;
        idata[(long)dvalue] = 0x7fff;
      }
    }
    else {
      *status = -0xb;
      idata[(long)dvalue] = -0x8000;
    }
  }
  return *status;
}

Assistant:

int imcomp_scalevaluesi2(
     short *idata, 
     long tilelen,
     double scale,
     double zero,
     int *status)
/*
   do inverse scaling the integer values.
*/
{
    long ii;
    double dvalue;
    
    for (ii=0; ii < tilelen; ii++)
    {
            dvalue = (idata[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
    }
    return(*status);
}